

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O1

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_struct
          (ProtocolReader *this,FieldType *value,EventKlassField *field,Event *event,
          Event *base_event)

{
  __node_base *p_Var1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  KlassRegister *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  Event *pEVar6;
  byte bVar7;
  bool bVar8;
  bool is_error;
  Event sub_event;
  bool local_131;
  FieldType *local_130;
  Event *local_128;
  undefined1 local_120 [32];
  char local_100 [16];
  Event local_f0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  Event local_80;
  
  p_Var1 = &local_f0._values._M_h._M_before_begin;
  pcVar2 = (field->_type_name)._M_dataplus._M_p;
  local_130 = value;
  local_128 = event;
  local_f0._values._M_h._M_buckets = &p_Var1->_M_nxt;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + (field->_type_name)._M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)&local_f0);
  if (iVar5 == 0) {
    local_a0[0] = local_90;
    pcVar2 = (field->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar2,pcVar2 + (field->_name)._M_string_length);
    iVar5 = std::__cxx11::string::compare((char *)local_a0);
    bVar8 = iVar5 == 0;
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0]);
    }
  }
  else {
    bVar8 = false;
  }
  if ((__node_base *)local_f0._values._M_h._M_buckets != p_Var1) {
    operator_delete(local_f0._values._M_h._M_buckets);
  }
  if (bVar8) {
    bVar7 = 1;
    if (this->_flat_events == false) {
      if (base_event == (Event *)0x0) {
        __assert_fail("base_event != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp"
                      ,0xdc,
                      "bool HawkTracer::parser::ProtocolReader::_read_struct(FieldType &, const EventKlassField &, Event *, Event *)"
                     );
      }
      pEVar6 = (Event *)operator_new(0x50);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)pEVar6,base_event,base_event);
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (base_event->_klass).
           super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (base_event->_klass).
               super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (base_event->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      (base_event->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pEVar6->_timestamp = base_event->_timestamp;
      local_130->f_EVENT = pEVar6;
    }
  }
  else {
    this_00 = this->_klass_register;
    pcVar2 = (field->_type_name)._M_dataplus._M_p;
    local_120._16_8_ = local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_120 + 0x10),pcVar2,pcVar2 + (field->_type_name)._M_string_length);
    KlassRegister::get_klass_id(this_00,(string *)(local_120 + 0x10));
    KlassRegister::get_klass((KlassRegister *)local_120,(HT_EventKlassId)this_00);
    local_f0._values._M_h._M_buckets = &local_f0._values._M_h._M_single_bucket;
    local_f0._values._M_h._M_bucket_count = 1;
    local_f0._values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_f0._values._M_h._M_element_count = 0;
    local_f0._values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_f0._values._M_h._M_rehash_policy._M_next_resize = 0;
    local_f0._values._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_f0._klass.
    super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_120._0_8_;
    local_f0._klass.
    super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_;
    local_120._0_8_ = 0;
    local_120._8_8_ = 0;
    local_f0._timestamp = 0xffffffffffffffff;
    if ((char *)local_120._16_8_ != local_100) {
      operator_delete((void *)local_120._16_8_);
    }
    _read_event(this,&local_131,&local_f0,base_event);
    if (this->_flat_events == true) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&local_80,&local_f0,&local_f0);
      local_80._klass.
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_f0._klass.
           super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_80._klass.
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_f0._klass.
           super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_f0._klass.
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_f0._klass.
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_80._timestamp = local_f0._timestamp;
      Event::merge(local_128,&local_80);
      Event::~Event(&local_80);
    }
    else {
      pEVar6 = (Event *)operator_new(0x50);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)pEVar6,&local_f0,&local_f0);
      _Var4._M_pi = local_f0._klass.
                    super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_f0._klass.
           super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f0._klass.
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      local_f0._klass.
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pEVar6->_timestamp = local_f0._timestamp;
      local_130->f_EVENT = pEVar6;
    }
    bVar7 = local_131 ^ 1;
    Event::~Event(&local_f0);
  }
  return (bool)bVar7;
}

Assistant:

bool ProtocolReader::_read_struct(FieldType& value, const EventKlassField& field, Event* event, Event* base_event)
{
    if (field.get_type_name() == "HT_Event" && field.get_name() == "base")
    {
        if (!_flat_events)
        {
            assert(base_event != nullptr);
            value.f_EVENT = new Event(std::move(*base_event));
        }
        return true;
    }
    else
    {
        bool is_error;
        Event sub_event(_klass_register->get_klass(_klass_register->get_klass_id(field.get_type_name())));
        _read_event(is_error, sub_event, base_event);
        if (_flat_events)
        {
            event->merge(std::move(sub_event));
        }
        else
        {
            value.f_EVENT = new Event(std::move(sub_event));
        }
        return !is_error;
    }
}